

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

ALchar * anon_unknown.dwarf_130c1::NameFromUserFmtType(UserFmtType type)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,type);
  switch(iVar1) {
  case 0:
    return "UInt8";
  case 1:
    return "Int16";
  case 2:
    return "Float32";
  case 3:
    return "Float64";
  case 4:
    return "muLaw";
  case 5:
    return "aLaw";
  }
  if (iVar1 == 0x80) {
    return "IMA4 ADPCM";
  }
  if (iVar1 != 0x81) {
    return "<internal type error>";
  }
  return "MSADPCM";
}

Assistant:

const ALchar *NameFromUserFmtType(UserFmtType type)
{
    switch(type)
    {
    case UserFmtUByte: return "UInt8";
    case UserFmtShort: return "Int16";
    case UserFmtFloat: return "Float32";
    case UserFmtDouble: return "Float64";
    case UserFmtMulaw: return "muLaw";
    case UserFmtAlaw: return "aLaw";
    case UserFmtIMA4: return "IMA4 ADPCM";
    case UserFmtMSADPCM: return "MSADPCM";
    }
    return "<internal type error>";
}